

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

isoent * isoent_create_virtual_dir(archive_write *a,iso9660_conflict *iso9660,char *pathname)

{
  archive_entry *paVar1;
  __uid_t _Var2;
  __gid_t _Var3;
  int iVar4;
  isofile *file_00;
  isoent *isoent;
  isofile *file;
  char *pathname_local;
  iso9660_conflict *iso9660_local;
  archive_write *a_local;
  
  file_00 = isofile_new(a,(archive_entry *)0x0);
  if (file_00 == (isofile *)0x0) {
    a_local = (archive_write *)0x0;
  }
  else {
    archive_entry_set_pathname(file_00->entry,pathname);
    archive_entry_unset_mtime(file_00->entry);
    archive_entry_unset_atime(file_00->entry);
    archive_entry_unset_ctime(file_00->entry);
    paVar1 = file_00->entry;
    _Var2 = getuid();
    archive_entry_set_uid(paVar1,(ulong)_Var2);
    paVar1 = file_00->entry;
    _Var3 = getgid();
    archive_entry_set_gid(paVar1,(ulong)_Var3);
    archive_entry_set_mode(file_00->entry,0x416d);
    archive_entry_set_nlink(file_00->entry,2);
    iVar4 = isofile_gen_utility_names(a,file_00);
    if (iVar4 < -0x14) {
      isofile_free(file_00);
      a_local = (archive_write *)0x0;
    }
    else {
      isofile_add_entry(iso9660,file_00);
      a_local = (archive_write *)isoent_new(file_00);
      if (a_local == (archive_write *)0x0) {
        a_local = (archive_write *)0x0;
      }
      else {
        *(byte *)&a_local->format_options = *(byte *)&a_local->format_options & 0xfd | 2;
        *(byte *)&a_local->format_options = *(byte *)&a_local->format_options & 0xfe | 1;
      }
    }
  }
  return (isoent *)a_local;
}

Assistant:

static struct isoent *
isoent_create_virtual_dir(struct archive_write *a, struct iso9660 *iso9660, const char *pathname)
{
	struct isofile *file;
	struct isoent *isoent;

	file = isofile_new(a, NULL);
	if (file == NULL)
		return (NULL);
	archive_entry_set_pathname(file->entry, pathname);
	archive_entry_unset_mtime(file->entry);
	archive_entry_unset_atime(file->entry);
	archive_entry_unset_ctime(file->entry);
	archive_entry_set_uid(file->entry, getuid());
	archive_entry_set_gid(file->entry, getgid());
	archive_entry_set_mode(file->entry, 0555 | AE_IFDIR);
	archive_entry_set_nlink(file->entry, 2);
	if (isofile_gen_utility_names(a, file) < ARCHIVE_WARN) {
		isofile_free(file);
		return (NULL);
	}
	isofile_add_entry(iso9660, file);

	isoent = isoent_new(file);
	if (isoent == NULL)
		return (NULL);
	isoent->dir = 1;
	isoent->virtual = 1;

	return (isoent);
}